

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::OneofOptions::~OneofOptions(OneofOptions *this)

{
  SharedDtor(this);
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::~RepeatedPtrField
            (&this->uninterpreted_option_);
  internal::ExtensionSet::~ExtensionSet(&this->_extensions_);
  return;
}

Assistant:

OneofOptions::~OneofOptions() {
  // @@protoc_insertion_point(destructor:google.protobuf.OneofOptions)
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}